

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O3

void coll_tmap_foreach(coll_tmap_t *map,_func_void_void_ptr_void_ptr *visit)

{
  coll_tmap_entry_t **ppcVar1;
  coll_tmap_entry_t *pcVar2;
  coll_tmap_entry_t *pcVar3;
  coll_tmap_entry_t *pcVar4;
  coll_tmap_entry_t *pcVar5;
  bool bVar6;
  
  pcVar3 = map->root;
  if (pcVar3 != (coll_tmap_entry_t *)0x0) {
    do {
      ppcVar1 = &pcVar3->left;
      pcVar2 = pcVar3;
      pcVar3 = *ppcVar1;
    } while (*ppcVar1 != (coll_tmap_entry_t *)0x0);
    do {
      pcVar3 = pcVar2->right;
      pcVar4 = pcVar2;
      if (pcVar2->right == (coll_tmap_entry_t *)0x0) {
        do {
          pcVar5 = pcVar4->parent;
          if (pcVar5 == (coll_tmap_entry_t *)0x0) {
            pcVar5 = (coll_tmap_entry_t *)0x0;
            break;
          }
          bVar6 = pcVar5->right == pcVar4;
          pcVar4 = pcVar5;
        } while (bVar6);
      }
      else {
        do {
          pcVar5 = pcVar3;
          pcVar3 = pcVar5->left;
        } while (pcVar5->left != (coll_tmap_entry_t *)0x0);
      }
      (*visit)(pcVar2->key,pcVar2->val);
      pcVar2 = pcVar5;
    } while (pcVar5 != (coll_tmap_entry_t *)0x0);
  }
  return;
}

Assistant:

void coll_tmap_foreach(coll_tmap_t *map, void (*visit)(void *, void *)) {
    entry_t *cur = entry_first(map->root);
    while (cur) {
        entry_t *next = entry_next(cur);
        visit(cur->key, cur->val);
        cur = next;
    }
}